

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall
cmMakefile::ExpandVariablesInString
          (cmMakefile *this,string *source,bool escapeQuotes,bool noEscapes,bool atOnly,
          char *filename,long line,bool removeEmpty,bool replaceAt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppcVar3;
  pointer pcVar4;
  PolicyStatus PVar5;
  MessageType MVar6;
  int iVar7;
  size_type extraout_RDX;
  size_type sVar8;
  long lVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  bool bVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg_new;
  string msg;
  string newResult;
  string msg_input;
  string newErrorstr;
  string original;
  string errorstr;
  string msg_old;
  
  errorstr._M_dataplus._M_p = (pointer)&errorstr.field_2;
  errorstr._M_string_length = 0;
  errorstr.field_2._M_local_buf[0] = '\0';
  original._M_dataplus._M_p = (pointer)&original.field_2;
  original._M_string_length = 0;
  original.field_2._M_local_buf[0] = '\0';
  if ((!noEscapes || !removeEmpty) && atOnly) {
    msg_input._M_dataplus._M_p = (pointer)&msg_input.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&msg_input,
               "ExpandVariablesInString @ONLY called on something with escapes.","");
    ppcVar3 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar3) {
      ppcVar3[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,INTERNAL_ERROR,&msg_input,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_input._M_dataplus._M_p == &msg_input.field_2) goto LAB_002a82df;
    lVar9 = CONCAT71(msg_input.field_2._M_allocated_capacity._1_7_,msg_input.field_2._M_local_buf[0]
                    );
    _Var10 = msg_input._M_dataplus;
  }
  else {
    newResult._M_dataplus._M_p = (pointer)&newResult.field_2;
    newResult._M_string_length = 0;
    newResult.field_2._M_local_buf[0] = '\0';
    newErrorstr._M_dataplus._M_p = (pointer)&newErrorstr.field_2;
    newErrorstr._M_string_length = 0;
    newErrorstr.field_2._M_local_buf[0] = '\0';
    PVar5 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0053,false);
    bVar11 = true;
    if (PVar5 - NEW < 3) {
      MVar6 = ExpandVariablesInStringNew
                        (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,replaceAt
                        );
      bVar12 = false;
    }
    else {
      bVar12 = false;
      if (PVar5 != OLD) {
        MVar6 = LOG;
        if (PVar5 != WARN) goto LAB_002a7f4b;
        std::__cxx11::string::_M_assign((string *)&original);
        std::__cxx11::string::_M_assign((string *)&newResult);
        this->SuppressSideEffects = true;
        MVar6 = ExpandVariablesInStringNew
                          (this,&newErrorstr,&newResult,escapeQuotes,noEscapes,atOnly,filename,line,
                           replaceAt);
        this->SuppressSideEffects = false;
        bVar11 = MVar6 == LOG;
        bVar12 = true;
      }
      MVar6 = ExpandVariablesInStringOld
                        (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,true);
    }
LAB_002a7f4b:
    if (MVar6 == LOG) {
      if (bVar12) {
        bVar12 = true;
        sVar8 = newResult._M_string_length;
        if (newResult._M_string_length == source->_M_string_length) {
          if (newResult._M_string_length == 0) {
            bVar12 = false;
          }
          else {
            iVar7 = bcmp(newResult._M_dataplus._M_p,(source->_M_dataplus)._M_p,
                         newResult._M_string_length);
            bVar12 = iVar7 != 0;
            sVar8 = extraout_RDX;
          }
        }
        if ((bVar12) || (!bVar11)) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&msg_new,(cmPolicies *)0x35,(PolicyID)sVar8);
          paVar2 = &msg_input.field_2;
          msg_input._M_dataplus._M_p = &DAT_00000001;
          msg_input.field_2._M_local_buf[0] = '\n';
          msg_old._M_dataplus._M_p = (pointer)msg_new._M_string_length;
          msg_old._M_string_length = (size_type)msg_new._M_dataplus._M_p;
          msg_old.field_2._M_allocated_capacity = 1;
          views._M_len = 2;
          views._M_array = (iterator)&msg_old;
          msg_input._M_string_length = (size_type)paVar2;
          msg_old.field_2._8_8_ = paVar2;
          cmCatViews_abi_cxx11_(&msg,views);
          paVar1 = &msg_new.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_new._M_dataplus._M_p != paVar1) {
            operator_delete(msg_new._M_dataplus._M_p,msg_new.field_2._M_allocated_capacity + 1);
          }
          msg_input._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&msg_input,original._M_dataplus._M_p,
                     original._M_dataplus._M_p + original._M_string_length);
          cmsys::SystemTools::ReplaceString(&msg_input,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_input._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&msg);
          pcVar4 = (source->_M_dataplus)._M_p;
          msg_old._M_dataplus._M_p = (pointer)&msg_old.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&msg_old,pcVar4,pcVar4 + source->_M_string_length);
          cmsys::SystemTools::ReplaceString(&msg_old,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_old._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&msg);
          msg_new._M_dataplus._M_p = (pointer)paVar1;
          if (bVar11) {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&msg_new,newResult._M_dataplus._M_p,
                       newResult._M_dataplus._M_p + newResult._M_string_length);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_new._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&msg);
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&msg_new,newErrorstr._M_dataplus._M_p,
                       newErrorstr._M_dataplus._M_p + newErrorstr._M_string_length);
            cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_new._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&msg);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_new._M_dataplus._M_p != paVar1) {
            operator_delete(msg_new._M_dataplus._M_p,msg_new.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&msg);
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&msg,
                              &this->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_old._M_dataplus._M_p != &msg_old.field_2) {
            operator_delete(msg_old._M_dataplus._M_p,msg_old.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg_input._M_dataplus._M_p != paVar2) {
            operator_delete(msg_input._M_dataplus._M_p,
                            CONCAT71(msg_input.field_2._M_allocated_capacity._1_7_,
                                     msg_input.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    else {
      if (MVar6 == FATAL_ERROR) {
        cmSystemTools::s_FatalErrorOccurred = true;
      }
      IssueMessage(this,MVar6,&errorstr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newErrorstr._M_dataplus._M_p != &newErrorstr.field_2) {
      operator_delete(newErrorstr._M_dataplus._M_p,
                      CONCAT71(newErrorstr.field_2._M_allocated_capacity._1_7_,
                               newErrorstr.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newResult._M_dataplus._M_p == &newResult.field_2) goto LAB_002a82df;
    lVar9 = CONCAT71(newResult.field_2._M_allocated_capacity._1_7_,newResult.field_2._M_local_buf[0]
                    );
    _Var10._M_p = newResult._M_dataplus._M_p;
  }
  operator_delete(_Var10._M_p,lVar9 + 1);
LAB_002a82df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)original._M_dataplus._M_p != &original.field_2) {
    operator_delete(original._M_dataplus._M_p,
                    CONCAT71(original.field_2._M_allocated_capacity._1_7_,
                             original.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errorstr._M_dataplus._M_p != &errorstr.field_2) {
    operator_delete(errorstr._M_dataplus._M_p,
                    CONCAT71(errorstr.field_2._M_allocated_capacity._1_7_,
                             errorstr.field_2._M_local_buf[0]) + 1);
  }
  return source;
}

Assistant:

const std::string& cmMakefile::ExpandVariablesInString(
  std::string& source, bool escapeQuotes, bool noEscapes, bool atOnly,
  const char* filename, long line, bool removeEmpty, bool replaceAt) const
{
  bool compareResults = false;
  MessageType mtype = MessageType::LOG;
  std::string errorstr;
  std::string original;

  // Sanity check the @ONLY mode.
  if (atOnly && (!noEscapes || !removeEmpty)) {
    // This case should never be called.  At-only is for
    // configure-file/string which always does no escapes.
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "ExpandVariablesInString @ONLY called "
                       "on something with escapes.");
    return source;
  }

  // Variables used in the WARN case.
  std::string newResult;
  std::string newErrorstr;
  MessageType newError = MessageType::LOG;

  switch (this->GetPolicyStatus(cmPolicies::CMP0053)) {
    case cmPolicies::WARN: {
      // Save the original string for the warning.
      original = source;
      newResult = source;
      compareResults = true;
      // Suppress variable watches to avoid calling hooks twice. Suppress new
      // dereferences since the OLD behavior is still what is actually used.
      this->SuppressSideEffects = true;
      newError = this->ExpandVariablesInStringNew(
        newErrorstr, newResult, escapeQuotes, noEscapes, atOnly, filename,
        line, replaceAt);
      this->SuppressSideEffects = false;
      CM_FALLTHROUGH;
    }
    case cmPolicies::OLD:
      mtype = this->ExpandVariablesInStringOld(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, removeEmpty, true);
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    // Messaging here would be *very* verbose.
    case cmPolicies::NEW:
      mtype = this->ExpandVariablesInStringNew(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, replaceAt);
      break;
  }

  // If it's an error in either case, just report the error...
  if (mtype != MessageType::LOG) {
    if (mtype == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
    this->IssueMessage(mtype, errorstr);
  }
  // ...otherwise, see if there's a difference that needs to be warned about.
  else if (compareResults && (newResult != source || newError != mtype)) {
    std::string msg =
      cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0053), '\n');

    std::string msg_input = original;
    cmSystemTools::ReplaceString(msg_input, "\n", "\n  ");
    msg += "For input:\n  '";
    msg += msg_input;
    msg += "'\n";

    std::string msg_old = source;
    cmSystemTools::ReplaceString(msg_old, "\n", "\n  ");
    msg += "the old evaluation rules produce:\n  '";
    msg += msg_old;
    msg += "'\n";

    if (newError == mtype) {
      std::string msg_new = newResult;
      cmSystemTools::ReplaceString(msg_new, "\n", "\n  ");
      msg += "but the new evaluation rules produce:\n  '";
      msg += msg_new;
      msg += "'\n";
    } else {
      std::string msg_err = newErrorstr;
      cmSystemTools::ReplaceString(msg_err, "\n", "\n  ");
      msg += "but the new evaluation rules produce an error:\n  ";
      msg += msg_err;
      msg += "\n";
    }

    msg +=
      "Using the old result for compatibility since the policy is not set.";

    this->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  return source;
}